

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::Parser
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,ScriptContext *scriptContext,
          ArenaAllocator *ctAllocator,StandardChars<unsigned_char> *standardEncodedChars,
          StandardChars<char16_t> *standardChars,bool isUtf8,DebugWriter *w)

{
  DecodeOptions DVar1;
  undefined3 in_register_00000089;
  
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = 0;
  this->scriptContext = scriptContext;
  this->ctAllocator = ctAllocator;
  this->standardEncodedChars = standardEncodedChars;
  this->standardChars = standardChars;
  this->w = w;
  this->input = (EncodedChar *)0x0;
  this->inputLim = (EncodedChar *)0x0;
  *(undefined8 *)((long)&this->inputLim + 1) = 0;
  *(undefined8 *)((long)&this->next + 1) = 0;
  this->numGroups = 1;
  this->nextGroupId = 1;
  this->positionAfterLastSurrogate = (EncodedChar *)0x0;
  this->litbuf = (Char *)0x0;
  this->litbufLen = 0;
  this->litbufNext = 0;
  this->surrogatePairList = (SurrogatePairTracker *)0x0;
  this->currentSurrogatePairNode = (SurrogatePairTracker *)0x0;
  *(undefined4 *)((long)&this->currentSurrogatePairNode + 7) = 0;
  this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
  this->tempLocationOfRange = (EncodedChar *)0x0;
  this->codePointAtTempLocation = 0;
  this->valueOfLastSurrogate = 0xffffffff;
  DVar1 = doAllowInvalidWCHARs;
  if (CONCAT31(in_register_00000089,isUtf8) == 0) {
    DVar1 = doAllowThreeByteSurrogates;
  }
  this->deferredIfNotUnicodeError = (ParseError *)0x0;
  this->deferredIfUnicodeError = (ParseError *)0x0;
  (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions = DVar1;
  return;
}

Assistant:

Parser<P, IsLiteral>::Parser
        ( Js::ScriptContext* scriptContext
        , ArenaAllocator* ctAllocator
        , StandardChars<EncodedChar>* standardEncodedChars
        , StandardChars<Char>* standardChars
        , bool isUtf8
#if ENABLE_REGEX_CONFIG_OPTIONS
        , DebugWriter* w
#endif
        )
        : scriptContext(scriptContext)
        , ctAllocator(ctAllocator)
        , standardEncodedChars(standardEncodedChars)
        , standardChars(standardChars)
#if ENABLE_REGEX_CONFIG_OPTIONS
        , w(w)
#endif
        , input(0)
        , inputLim(0)
        , next(0)
        , inBody(false)
        , numGroups(1)
        , nextGroupId(1) // implicit overall group always takes index 0
        , litbuf(0)
        , litbufLen(0)
        , litbufNext(0)
        , surrogatePairList(nullptr)
        , currentSurrogatePairNode(nullptr)
        , tempLocationOfSurrogatePair(nullptr)
        , tempLocationOfRange(nullptr)
        , codePointAtTempLocation(0)
        , unicodeFlagPresent(false)
        , dotAllFlagPresent(false)
        , caseInsensitiveFlagPresent(false)
        , positionAfterLastSurrogate(nullptr)
        , valueOfLastSurrogate(INVALID_CODEPOINT)
        , deferredIfNotUnicodeError(nullptr)
        , deferredIfUnicodeError(nullptr)
    {
        this->SetIsUtf8(isUtf8);
    }